

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grib2dec.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  Output *pOVar4;
  Parameters params;
  G2DEC_Message message;
  
  params.inputFile._M_dataplus._M_p = (pointer)&params.inputFile.field_2;
  params.inputFile._M_string_length = 0;
  params.inputFile.field_2._M_local_buf[0] = '\0';
  params.outputFile._M_dataplus._M_p = (pointer)&params.outputFile.field_2;
  params.outputFile._M_string_length = 0;
  params.outputFile.field_2._M_local_buf[0] = '\0';
  params.outputFormat._M_dataplus._M_p = (pointer)&params.outputFormat.field_2;
  params.outputFormat._M_string_length = 0;
  params.outputFormat.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    usage();
    iVar2 = -1;
  }
  else {
    bVar1 = parseArguments(argc,argv,&params);
    iVar2 = -1;
    if (bVar1) {
      plVar3 = (long *)grib2dec::Grib2Dec::create(params.inputFile._M_dataplus._M_p);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))(plVar3,&params.filter);
        pOVar4 = grib2dec_demo::Output::create(&params.outputFile,&params.outputFormat);
        do {
          while( true ) {
            iVar2 = (**(code **)*plVar3)(plVar3,&message);
            if (iVar2 != 0) break;
            if (message.valuesLength != message.grid.nj * message.grid.ni) {
              __assert_fail("message.valuesLength == message.grid.ni * message.grid.nj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/LouJo[P]grib2dec/apps/grib2dec.cpp"
                            ,0x6b,"int main(int, char **)");
            }
            (**pOVar4->_vptr_Output)(pOVar4,&message);
          }
        } while (iVar2 != 1);
        (*pOVar4->_vptr_Output[1])(pOVar4);
        (*pOVar4->_vptr_Output[3])(pOVar4);
        (**(code **)(*plVar3 + 0x18))(plVar3);
        iVar2 = 0;
      }
    }
  }
  Parameters::~Parameters(&params);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    Parameters params;

    if (argc < 2)
        return usage(), -1;

    if (!parseArguments(argc, argv, params))
        return -1;

    grib2dec::Grib2Dec *decoder =
            grib2dec::Grib2Dec::create(params.inputFile.c_str());

    if (!decoder)
        return -1;

    decoder->setSpatialFilter(params.filter);

    Output *output = Output::create(params.outputFile, params.outputFormat);

    int nbMessages = 0;

    while (true) {
        G2DEC_Message message;
        auto status = decoder->nextMessage(message);
        if (status == G2DEC_STATUS_END)
            break;
        else if (status == G2DEC_STATUS_OK) {
            assert(message.valuesLength == message.grid.ni * message.grid.nj);
            output->setComponent(message);
            nbMessages++;
        }
    }

    output->end();

    delete output;
    delete decoder;

    return 0;
}